

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O2

void delds(int D,int s,double *C)

{
  double *B;
  double *A;
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  lVar3 = (long)s;
  B = (double *)malloc(lVar3 * 8 + 8);
  A = (double *)malloc((long)(s * D) * 8 + 8);
  for (lVar1 = 0; lVar1 <= lVar3; lVar1 = lVar1 + 1) {
    B[lVar1] = 0.0;
  }
  *B = 1.0;
  B[lVar3] = -1.0;
  *A = 1.0;
  uVar4 = 0;
  uVar2 = (ulong)(uint)D;
  if (D < 1) {
    uVar2 = uVar4;
  }
  while (uVar4 != uVar2) {
    poly(A,B,C,s * (int)uVar4 + 1,s + 1);
    uVar4 = uVar4 + 1;
    for (lVar1 = 0; lVar1 <= (long)(uVar4 * lVar3); lVar1 = lVar1 + 1) {
      A[lVar1] = C[lVar1];
    }
  }
  free(B);
  free(A);
  return;
}

Assistant:

void delds(int D, int s, double *C) {
	int i,j;
	double *vec,*oup;
	/*
	 * delds returns coefficients of [1,....(s-1) zeroes,.. -1]^D
	 * eg., D =1 s = 4 yields
	 * [1,0,0,0,-1]
	 * D=2 s=4 -> [1,0,0,0,-2,0,0,0,1]
	 */ 
	/*
	 * s - seasonal component
	 * s = 4 (quarterly data), 12 (yearly data) etc.
	 * D - Differencing operator. D >= 1 when seasonal component is present
	 * D is usually 1 when seasonal component is present. D = 0 means no
	 * seasonal component
	 */ 
	vec = (double*) malloc(sizeof(double) * (s+1));
	oup = (double*) malloc(sizeof(double) * (D*s + 1));
	for(i = 0; i < s+1; ++i) {
		vec[i] = 0.;
	}
	vec[0] = 1.0;
	vec[s] = -1.0;
	oup[0] = 1.0;
	
	for(i = 0; i < D; ++i) {
		poly(oup,vec,C,i*s+1,s+1);
		for(j = 0; j < s*(i+1)+1; ++j) {
			oup[j] = C[j];
		}
		
	}
	free(vec);
	free(oup);
}